

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3FkCheck(Parse *pParse,Table *pTab,int regOld,int regNew)

{
  int *piVar1;
  u8 uVar2;
  sqlite3 *db;
  Index *pIdx_00;
  Parse *pParse_00;
  int iVar3;
  int iVar4;
  int iVar5;
  Table *pTVar6;
  Vdbe *p;
  FKey *pFVar7;
  SrcList *pSrc;
  undefined4 in_register_00000014;
  int *aiCol;
  ulong uVar8;
  long lVar9;
  uint isIgnore;
  FKey **ppFVar10;
  sColMap *psVar11;
  char *zDbase;
  int *aiFree;
  Table *local_68;
  Index *pIdx;
  Parse *local_58;
  undefined8 local_50;
  int local_48;
  int iCol;
  char *local_40;
  ulong local_38;
  
  local_50 = CONCAT44(in_register_00000014,regOld);
  db = pParse->db;
  if ((db->flags & 0x40000) != 0) {
    uVar8 = (ulong)(uint)regNew;
    uVar2 = pParse->disableTriggers;
    local_68 = pTab;
    iVar3 = sqlite3SchemaToIndex(db,pTab->pSchema);
    zDbase = db->aDb[iVar3].zName;
    local_48 = (int)local_50 + 1;
    ppFVar10 = &pTab->pFKey;
    local_58 = pParse;
    local_40 = zDbase;
    local_38 = uVar8;
    while (pFVar7 = *ppFVar10, pFVar7 != (FKey *)0x0) {
      pIdx = (Index *)0x0;
      aiFree = (int *)0x0;
      if (pParse->disableTriggers == '\0') {
        pTVar6 = sqlite3LocateTable(pParse,0,pFVar7->zTo,zDbase);
      }
      else {
        pTVar6 = sqlite3FindTable(db,pFVar7->zTo,zDbase);
      }
      if ((pTVar6 == (Table *)0x0) ||
         (iVar4 = sqlite3FkLocateIndex(pParse,pTVar6,pFVar7,&pIdx,&aiFree), pIdx_00 = pIdx,
         iVar4 != 0)) {
        if (uVar2 == '\0') {
          return;
        }
        if (db->mallocFailed != '\0') {
          return;
        }
        if (pTVar6 == (Table *)0x0) {
          p = sqlite3GetVdbe(pParse);
          iVar5 = pFVar7->nCol;
          iVar4 = p->nOp + iVar5;
          psVar11 = pFVar7->aCol;
          for (lVar9 = 0; lVar9 < iVar5; lVar9 = lVar9 + 1) {
            sqlite3VdbeAddOp2(p,0x49,psVar11->iFrom + local_48,iVar4 + 1);
            iVar5 = pFVar7->nCol;
            psVar11 = psVar11 + 1;
          }
          sqlite3VdbeAddOp2(p,0x75,(uint)pFVar7->isDeferred,-1);
          uVar8 = local_38;
          zDbase = local_40;
        }
      }
      else {
        aiCol = aiFree;
        if (aiFree == (int *)0x0) {
          iCol = pFVar7->aCol[0].iFrom;
          aiCol = &iCol;
        }
        isIgnore = 0;
        for (lVar9 = 0; pParse_00 = local_58, lVar9 < pFVar7->nCol; lVar9 = lVar9 + 1) {
          if (aiCol[lVar9] == (int)local_68->iPKey) {
            aiCol[lVar9] = -1;
          }
          if (db->xAuth != (_func_int_void_ptr_int_char_ptr_char_ptr_char_ptr_char_ptr *)0x0) {
            if (pIdx_00 == (Index *)0x0) {
              iVar4 = (int)pTVar6->iPKey;
            }
            else {
              iVar4 = pIdx_00->aiColumn[lVar9];
            }
            iVar4 = sqlite3AuthReadCol(local_58,pTVar6->zName,pTVar6->aCol[iVar4].zName,iVar3);
            isIgnore = (uint)(iVar4 == 2);
          }
        }
        sqlite3TableLock(local_58,iVar3,pTVar6->tnum,'\0',pTVar6->zName);
        piVar1 = &pParse_00->nTab;
        *piVar1 = *piVar1 + 1;
        if ((int)local_50 != 0) {
          fkLookupParent(pParse_00,iVar3,pTVar6,pIdx_00,pFVar7,aiCol,(int)local_50,-1,isIgnore);
        }
        uVar8 = local_38;
        if ((int)local_38 != 0) {
          fkLookupParent(local_58,iVar3,pTVar6,pIdx_00,pFVar7,aiCol,(int)local_38,1,isIgnore);
        }
        sqlite3DbFree(db,aiFree);
        pParse = local_58;
        zDbase = local_40;
      }
      ppFVar10 = &pFVar7->pNextFrom;
    }
    pFVar7 = sqlite3FkReferences(local_68);
    for (; pFVar7 != (FKey *)0x0; pFVar7 = pFVar7->pNextTo) {
      pIdx = (Index *)0x0;
      aiFree = (int *)0x0;
      if (((pFVar7->isDeferred != '\0') || (pParse->pToplevel != (Parse *)0x0)) ||
         (pParse->isMultiWrite != '\0')) {
        iVar3 = sqlite3FkLocateIndex(pParse,local_68,pFVar7,&pIdx,&aiFree);
        if (iVar3 == 0) {
          pSrc = sqlite3SrcListAppend(db,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
          if (pSrc != (SrcList *)0x0) {
            pTVar6 = pFVar7->pFrom;
            pSrc->a[0].pTab = pTVar6;
            pSrc->a[0].zName = pTVar6->zName;
            pTVar6->nRef = pTVar6->nRef + 1;
            iVar3 = pParse->nTab;
            pParse->nTab = iVar3 + 1;
            pSrc->a[0].iCursor = iVar3;
            if ((int)uVar8 != 0) {
              fkScanChildren(pParse,pSrc,local_68,pIdx,pFVar7,aiFree,(int)uVar8,-1);
            }
            if ((int)local_50 != 0) {
              fkScanChildren(pParse,pSrc,local_68,pIdx,pFVar7,aiFree,(int)local_50,1);
            }
            pSrc->a[0].zName = (char *)0x0;
            sqlite3SrcListDelete(db,pSrc);
          }
          sqlite3DbFree(db,aiFree);
        }
        else {
          if (uVar2 == '\0') {
            return;
          }
          if (db->mallocFailed != '\0') {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkCheck(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Row is being deleted from this table */ 
  int regOld,                     /* Previous row data is stored here */
  int regNew                      /* New row data is stored here */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  FKey *pFKey;                    /* Used to iterate through FKs */
  int iDb;                        /* Index of database containing pTab */
  const char *zDb;                /* Name of database containing pTab */
  int isIgnoreErrors = pParse->disableTriggers;

  /* Exactly one of regOld and regNew should be non-zero. */
  assert( (regOld==0)!=(regNew==0) );

  /* If foreign-keys are disabled, this function is a no-op. */
  if( (db->flags&SQLITE_ForeignKeys)==0 ) return;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  zDb = db->aDb[iDb].zName;

  /* Loop through all the foreign key constraints for which pTab is the
  ** child table (the table that the foreign key definition is part of).  */
  for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
    Table *pTo;                   /* Parent table of foreign key pFKey */
    Index *pIdx = 0;              /* Index on key columns in pTo */
    int *aiFree = 0;
    int *aiCol;
    int iCol;
    int i;
    int isIgnore = 0;

    /* Find the parent table of this foreign key. Also find a unique index 
    ** on the parent key columns in the parent table. If either of these 
    ** schema items cannot be located, set an error in pParse and return 
    ** early.  */
    if( pParse->disableTriggers ){
      pTo = sqlite3FindTable(db, pFKey->zTo, zDb);
    }else{
      pTo = sqlite3LocateTable(pParse, 0, pFKey->zTo, zDb);
    }
    if( !pTo || sqlite3FkLocateIndex(pParse, pTo, pFKey, &pIdx, &aiFree) ){
      assert( isIgnoreErrors==0 || (regOld!=0 && regNew==0) );
      if( !isIgnoreErrors || db->mallocFailed ) return;
      if( pTo==0 ){
        /* If isIgnoreErrors is true, then a table is being dropped. In this
        ** case SQLite runs a "DELETE FROM xxx" on the table being dropped
        ** before actually dropping it in order to check FK constraints.
        ** If the parent table of an FK constraint on the current table is
        ** missing, behave as if it is empty. i.e. decrement the relevant
        ** FK counter for each row of the current table with non-NULL keys.
        */
        Vdbe *v = sqlite3GetVdbe(pParse);
        int iJump = sqlite3VdbeCurrentAddr(v) + pFKey->nCol + 1;
        for(i=0; i<pFKey->nCol; i++){
          int iReg = pFKey->aCol[i].iFrom + regOld + 1;
          sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iJump);
        }
        sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, -1);
      }
      continue;
    }
    assert( pFKey->nCol==1 || (aiFree && pIdx) );

    if( aiFree ){
      aiCol = aiFree;
    }else{
      iCol = pFKey->aCol[0].iFrom;
      aiCol = &iCol;
    }
    for(i=0; i<pFKey->nCol; i++){
      if( aiCol[i]==pTab->iPKey ){
        aiCol[i] = -1;
      }
#ifndef SQLITE_OMIT_AUTHORIZATION
      /* Request permission to read the parent key columns. If the 
      ** authorization callback returns SQLITE_IGNORE, behave as if any
      ** values read from the parent table are NULL. */
      if( db->xAuth ){
        int rcauth;
        char *zCol = pTo->aCol[pIdx ? pIdx->aiColumn[i] : pTo->iPKey].zName;
        rcauth = sqlite3AuthReadCol(pParse, pTo->zName, zCol, iDb);
        isIgnore = (rcauth==SQLITE_IGNORE);
      }
#endif
    }

    /* Take a shared-cache advisory read-lock on the parent table. Allocate 
    ** a cursor to use to search the unique index on the parent key columns 
    ** in the parent table.  */
    sqlite3TableLock(pParse, iDb, pTo->tnum, 0, pTo->zName);
    pParse->nTab++;

    if( regOld!=0 ){
      /* A row is being removed from the child table. Search for the parent.
      ** If the parent does not exist, removing the child row resolves an 
      ** outstanding foreign key constraint violation. */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regOld, -1,isIgnore);
    }
    if( regNew!=0 ){
      /* A row is being added to the child table. If a parent row cannot
      ** be found, adding the child row has violated the FK constraint. */ 
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regNew, +1,isIgnore);
    }

    sqlite3DbFree(db, aiFree);
  }

  /* Loop through all the foreign key constraints that refer to this table */
  for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
    Index *pIdx = 0;              /* Foreign key index for pFKey */
    SrcList *pSrc;
    int *aiCol = 0;

    if( !pFKey->isDeferred && !pParse->pToplevel && !pParse->isMultiWrite ){
      assert( regOld==0 && regNew!=0 );
      /* Inserting a single row into a parent table cannot cause an immediate
      ** foreign key violation. So do nothing in this case.  */
      continue;
    }

    if( sqlite3FkLocateIndex(pParse, pTab, pFKey, &pIdx, &aiCol) ){
      if( !isIgnoreErrors || db->mallocFailed ) return;
      continue;
    }
    assert( aiCol || pFKey->nCol==1 );

    /* Create a SrcList structure containing a single table (the table 
    ** the foreign key that refers to this table is attached to). This
    ** is required for the sqlite3WhereXXX() interface.  */
    pSrc = sqlite3SrcListAppend(db, 0, 0, 0);
    if( pSrc ){
      struct SrcList_item *pItem = pSrc->a;
      pItem->pTab = pFKey->pFrom;
      pItem->zName = pFKey->pFrom->zName;
      pItem->pTab->nRef++;
      pItem->iCursor = pParse->nTab++;
  
      if( regNew!=0 ){
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regNew, -1);
      }
      if( regOld!=0 ){
        /* If there is a RESTRICT action configured for the current operation
        ** on the parent table of this FK, then throw an exception 
        ** immediately if the FK constraint is violated, even if this is a
        ** deferred trigger. That's what RESTRICT means. To defer checking
        ** the constraint, the FK should specify NO ACTION (represented
        ** using OE_None). NO ACTION is the default.  */
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regOld, 1);
      }
      pItem->zName = 0;
      sqlite3SrcListDelete(db, pSrc);
    }
    sqlite3DbFree(db, aiCol);
  }
}